

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.h
# Opt level: O0

void __thiscall crnlib::data_stream::~data_stream(data_stream *this)

{
  code *pcVar1;
  data_stream *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~data_stream() {}